

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O2

AggregateFunction * __thiscall
duckdb::
GetArgMinMaxFunctionInternal<duckdb::ArgMinMaxBase<duckdb::LessThan,false>,duckdb::string_t,long>
          (AggregateFunction *__return_storage_ptr__,duckdb *this,LogicalType *by_type,
          LogicalType *type)

{
  LogicalType *in_R8;
  LogicalType LStack_38;
  
  LogicalType::LogicalType(&LStack_38,by_type);
  AggregateFunction::
  BinaryAggregate<duckdb::ArgMinMaxState<duckdb::string_t,long>,duckdb::string_t,long,duckdb::string_t,duckdb::ArgMinMaxBase<duckdb::LessThan,false>,(duckdb::AggregateDestructorType)1>
            (__return_storage_ptr__,(AggregateFunction *)by_type,(LogicalType *)this,&LStack_38,
             in_R8);
  LogicalType::~LogicalType(&LStack_38);
  if ((by_type->physical_type_ == VARCHAR) || (this[1] == (duckdb)0xc8)) {
    __return_storage_ptr__->destructor =
         AggregateFunction::
         StateDestroy<duckdb::ArgMinMaxState<duckdb::string_t,long>,duckdb::ArgMinMaxBase<duckdb::LessThan,false>>
    ;
  }
  __return_storage_ptr__->bind = ArgMinMaxBase<duckdb::LessThan,_false>::Bind;
  return __return_storage_ptr__;
}

Assistant:

AggregateFunction GetArgMinMaxFunctionInternal(const LogicalType &by_type, const LogicalType &type) {
#ifndef DUCKDB_SMALLER_BINARY
	using STATE = ArgMinMaxState<ARG_TYPE, BY_TYPE>;
	auto function =
	    AggregateFunction::BinaryAggregate<STATE, ARG_TYPE, BY_TYPE, ARG_TYPE, OP, AggregateDestructorType::LEGACY>(
	        type, by_type, type);
	if (type.InternalType() == PhysicalType::VARCHAR || by_type.InternalType() == PhysicalType::VARCHAR) {
		function.destructor = AggregateFunction::StateDestroy<STATE, OP>;
	}
	function.bind = OP::Bind;
#else
	auto function = GetGenericArgMinMaxFunction<OP>();
	function.arguments = {type, by_type};
	function.return_type = type;
#endif
	return function;
}